

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

bool __thiscall llvm::detail::IEEEFloat::isDenormal(IEEEFloat *this)

{
  bool bVar1;
  int iVar2;
  integerPart *parts;
  bool local_11;
  IEEEFloat *this_local;
  
  bVar1 = isFiniteNonZero(this);
  local_11 = false;
  if ((bVar1) && (local_11 = false, this->exponent == this->semantics->minExponent)) {
    parts = significandParts(this);
    iVar2 = APInt::tcExtractBit(parts,this->semantics->precision - 1);
    local_11 = iVar2 == 0;
  }
  return local_11;
}

Assistant:

bool IEEEFloat::isDenormal() const {
  return isFiniteNonZero() && (exponent == semantics->minExponent) &&
         (APInt::tcExtractBit(significandParts(),
                              semantics->precision - 1) == 0);
}